

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

int32_t __thiscall icu_63::RBBITableBuilder::removeDuplicateStates(RBBITableBuilder *this)

{
  bool bVar1;
  int local_24;
  int local_20;
  int32_t numStatesRemoved;
  IntPair local_18;
  IntPair dupls;
  RBBITableBuilder *this_local;
  
  numStatesRemoved = 3;
  local_20 = 0;
  dupls = (IntPair)this;
  std::pair<int,_int>::pair<int,_int,_true>(&local_18,&numStatesRemoved,&local_20);
  local_24 = 0;
  while( true ) {
    bVar1 = findDuplicateState(this,&local_18);
    if (!bVar1) break;
    removeState(this,local_18);
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int32_t RBBITableBuilder::removeDuplicateStates() {
    IntPair dupls = {3, 0};
    int32_t numStatesRemoved = 0;

    while (findDuplicateState(&dupls)) {
        // printf("Removing duplicate states (%d, %d)\n", dupls.first, dupls.second);
        removeState(dupls);
        ++numStatesRemoved;
    }
    return numStatesRemoved;
}